

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkreplyimpl_p.cpp
# Opt level: O2

int __thiscall QNetworkReplyImpl::qt_metacall(QNetworkReplyImpl *this,Call _c,int _id,void **_a)

{
  uint _id_00;
  void **_a_00;
  
  _a_00 = _a;
  _id_00 = QNetworkReply::qt_metacall((QNetworkReply *)this,_c,_id,_a);
  if (-1 < (int)_id_00) {
    if (_c == RegisterMethodArgumentMetaType) {
      if (_id_00 < 5) {
        *(undefined8 *)*_a = 0;
      }
    }
    else {
      if (_c != InvokeMetaMethod) {
        return _id_00;
      }
      if (_id_00 < 5) {
        qt_static_metacall((QObject *)this,InvokeMetaMethod,_id_00,_a_00);
      }
    }
    _id_00 = _id_00 - 5;
  }
  return _id_00;
}

Assistant:

int QNetworkReplyImpl::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QNetworkReply::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 5)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 5;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 5)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 5;
    }
    return _id;
}